

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlneuron.cxx
# Opt level: O0

void __thiscall MlNeuron::~MlNeuron(MlNeuron *this)

{
  ~MlNeuron((MlNeuron *)
            ((long)&this[-1].mlneuronRelaxation.super_StochasticVariable.super_StochasticProcess.
                    stochDescription.field_2 + 8));
  return;
}

Assistant:

void MlNeuron::prepareNextState()
{
	// create next value of differential equation
	mlneuronMembrane.prepareNextState();
	stochNextStateIsPrepared = mlneuronMembrane.isNextStatePrepared();
	stochNextValue = mlneuronMembrane.getNextValue();
	
	// proceed if calculation was successful
	if (stochNextStateIsPrepared) {
		if (stochNextValue > mlneuronTheta)
			eventNextValue = true;
		else 
			eventNextValue = false;
	}
}